

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O2

void __thiscall apngasm_cli::CLI::CLI(CLI *this,int argc,char **argv)

{
  APNGAsm *this_00;
  int iVar1;
  IAPNGAsmListener *pIVar2;
  
  Options::Options(&this->options,argc,argv);
  this_00 = &this->assembler;
  apngasm::APNGAsm::APNGAsm(this_00);
  pIVar2 = (IAPNGAsmListener *)operator_new(0x18);
  iVar1 = Options::getOverwriteMode(&this->options);
  pIVar2->_vptr_IAPNGAsmListener = (_func_int **)&PTR__IAPNGAsmListener_001553e0;
  pIVar2[1]._vptr_IAPNGAsmListener = (_func_int **)this_00;
  *(int *)&pIVar2[2]._vptr_IAPNGAsmListener = iVar1;
  this->pListener = pIVar2;
  apngasm::APNGAsm::setAPNGAsmListener((IAPNGAsmListener *)this_00);
  return;
}

Assistant:

CLI::CLI(int argc, char **argv) : options(argc, argv), assembler() {
  pListener = new CustomAPNGAsmListener(&assembler, options.getOverwriteMode());
  assembler.setAPNGAsmListener(pListener);
}